

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

bool __thiscall VmaDedicatedAllocationList::IsEmpty(VmaDedicatedAllocationList *this)

{
  bool bVar1;
  size_t sVar2;
  pthread_rwlock_t *__rwlock;
  
  bVar1 = this->m_UseMutex;
  __rwlock = (pthread_rwlock_t *)0x0;
  if (bVar1 != false) {
    __rwlock = (pthread_rwlock_t *)&this->m_Mutex;
  }
  if (bVar1 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  sVar2 = (this->m_AllocationList).m_Count;
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return sVar2 == 0;
}

Assistant:

bool VmaDedicatedAllocationList::IsEmpty()
{
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);
    return m_AllocationList.IsEmpty();
}